

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.cpp
# Opt level: O0

int duckdb_brotli::BrotliDecoderHuffmanTreeGroupInit
              (BrotliDecoderStateInternal *s,HuffmanTreeGroup *group,uint64_t alphabet_size_max,
              uint64_t alphabet_size_limit,uint64_t ntrees)

{
  long lVar1;
  long in_RCX;
  undefined2 in_DX;
  long *in_RSI;
  long in_RDI;
  long in_R8;
  HuffmanCode **p;
  size_t htree_size;
  size_t code_size;
  size_t max_table_size;
  
  lVar1 = (**(code **)(in_RDI + 0x30))
                    (*(undefined8 *)(in_RDI + 0x40),in_R8 * 4 * (in_RCX + 0x178) + in_R8 * 8);
  *(undefined2 *)(in_RSI + 2) = in_DX;
  *(short *)((long)in_RSI + 0x12) = (short)in_RCX;
  *(short *)((long)in_RSI + 0x14) = (short)in_R8;
  *in_RSI = lVar1;
  in_RSI[1] = lVar1 + in_R8 * 8;
  return (int)(lVar1 != 0);
}

Assistant:

BROTLI_BOOL duckdb_brotli::BrotliDecoderHuffmanTreeGroupInit(BrotliDecoderState* s,
    HuffmanTreeGroup* group, brotli_reg_t alphabet_size_max,
    brotli_reg_t alphabet_size_limit, brotli_reg_t ntrees) {
  /* 376 = 256 (1-st level table) + 4 + 7 + 15 + 31 + 63 (2-nd level mix-tables)
     This number is discovered "unlimited" "enough" calculator; it is actually
     a wee bigger than required in several cases (especially for alphabets with
     less than 16 symbols). */
  const size_t max_table_size = alphabet_size_limit + 376;
  const size_t code_size = sizeof(HuffmanCode) * ntrees * max_table_size;
  const size_t htree_size = sizeof(HuffmanCode*) * ntrees;
  /* Pointer alignment is, hopefully, wider than sizeof(HuffmanCode). */
  HuffmanCode** p = (HuffmanCode**)BROTLI_DECODER_ALLOC(s,
      code_size + htree_size);
  group->alphabet_size_max = (uint16_t)alphabet_size_max;
  group->alphabet_size_limit = (uint16_t)alphabet_size_limit;
  group->num_htrees = (uint16_t)ntrees;
  group->htrees = p;
  group->codes = (HuffmanCode*)(&p[ntrees]);
  return !!p;
}